

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

optional<std::string> * __thiscall
Commands::find_entity_name_abi_cxx11_
          (optional<std::string> *__return_storage_ptr__,Commands *this,EntityType type)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  undefined6 in_register_00000012;
  pointer local_40;
  size_type local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  if ((int)CONCAT62(in_register_00000012,type) == 0) {
    local_40 = (pointer)&local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"NONE","");
    (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).init_ = true;
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>)
                     .storage_ + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_ =
         puVar1;
    if (local_40 == (pointer)&local_30) {
      *puVar1 = local_30;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).
               storage_ + 0x18) = uStack_28;
    }
    else {
      (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_.
      value_._M_dataplus._M_p = local_40;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).
               storage_ + 0x10) = local_30;
    }
    (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_.value_.
    _M_string_length = local_38;
  }
  else {
    for (p_Var2 = (this->entities)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->entities)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      if ((short)p_Var2[2]._M_color == type) {
        (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).init_ = true
        ;
        (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_.
        value_._M_dataplus._M_p =
             (pointer)((long)&(__return_storage_ptr__->
                              super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_ + 0x10
                      );
        std::__cxx11::string::_M_construct<char*>
                  ((string *)
                   &(__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).
                    storage_,*(long *)(p_Var2 + 1),
                   (long)&(p_Var2[1]._M_parent)->_M_color + *(long *)(p_Var2 + 1));
        return __return_storage_ptr__;
      }
    }
    (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).init_ = false;
    (__return_storage_ptr__->super_OptionalBase<std::__cxx11::basic_string<char>_>).storage_.dummy_
         = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

optional<std::string> Commands::find_entity_name(EntityType type) const
{
    if(type == 0)
        return std::string("NONE");

    for(auto& pair : this->entities)
    {
        if(pair.second == type)
            return pair.first;
    }

    return nullopt;
}